

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
          (Persistence_landscape_on_grid *this,char *filename,size_t number_of_points_,
          uint number_of_levels_of_landscape,uint16_t dimension)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  size_type sVar3;
  reference pvVar4;
  double dVar5;
  size_type local_e8;
  size_t i;
  double grid_max_;
  double grid_min_;
  string local_c8;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_a8;
  allocator<char> local_79;
  string local_78;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_58;
  undefined1 local_40 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> p;
  uint16_t dimension_local;
  uint number_of_levels_of_landscape_local;
  size_t number_of_points__local;
  char *filename_local;
  Persistence_landscape_on_grid *this_local;
  
  p.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_ = dimension;
  p.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = number_of_levels_of_landscape;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->values_of_landscapes);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_40);
  uVar1 = p.
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._2_2_;
  uVar2 = std::numeric_limits<unsigned_short>::max();
  if (uVar1 == uVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,filename,&local_79);
    read_persistence_intervals_in_one_dimension_from_file(&local_58,&local_78,-1,-1.0);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_40,&local_58);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              (&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,filename,(allocator<char> *)((long)&grid_min_ + 7));
    read_persistence_intervals_in_one_dimension_from_file
              (&local_a8,&local_c8,
               (uint)p.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._2_2_,-1.0);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_40,&local_a8);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              (&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&grid_min_ + 7));
  }
  grid_max_ = std::numeric_limits<double>::max();
  dVar5 = std::numeric_limits<double>::max();
  i = (size_t)-dVar5;
  local_e8 = 0;
  while( true ) {
    sVar3 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 local_40);
    if (local_e8 == sVar3) break;
    pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)local_40,local_e8);
    if (pvVar4->first < grid_max_) {
      pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)local_40,local_e8);
      grid_max_ = pvVar4->first;
    }
    pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)local_40,local_e8);
    if ((double)i < pvVar4->second) {
      pvVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           *)local_40,local_e8);
      i = (size_t)pvVar4->second;
    }
    local_e8 = local_e8 + 1;
  }
  set_up_values_of_landscapes
            (this,(vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  local_40,grid_max_,(double)i,number_of_points_,
             p.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_40);
  return;
}

Assistant:

Persistence_landscape_on_grid::Persistence_landscape_on_grid(const char* filename, size_t number_of_points_,
                                                             unsigned number_of_levels_of_landscape,
                                                             uint16_t dimension) {
  std::vector<std::pair<double, double> > p;
  if (dimension == std::numeric_limits<uint16_t>::max()) {
    p = read_persistence_intervals_in_one_dimension_from_file(filename);
  } else {
    p = read_persistence_intervals_in_one_dimension_from_file(filename, dimension);
  }
  double grid_min_ = std::numeric_limits<double>::max();
  double grid_max_ = -std::numeric_limits<double>::max();
  for (size_t i = 0; i != p.size(); ++i) {
    if (p[i].first < grid_min_) grid_min_ = p[i].first;
    if (p[i].second > grid_max_) grid_max_ = p[i].second;
  }
  this->set_up_values_of_landscapes(p, grid_min_, grid_max_, number_of_points_, number_of_levels_of_landscape);
}